

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O0

LINK_HANDLE
create_link(role link_role,SESSION_HANDLE session_handle,AMQP_MESSENGER_LINK_CONFIG *link_config,
           char *iothub_host_fqdn,char *device_id,char *module_id)

{
  AMQP_MESSENGER_LINK_CONFIG *session;
  int iVar1;
  char *name;
  LOGGER_LOG p_Var2;
  char *local_a8;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  AMQP_VALUE target;
  AMQP_VALUE source;
  LOGGER_LOG l_1;
  STRING_HANDLE link_name;
  LOGGER_LOG l;
  STRING_HANDLE link_address;
  LINK_HANDLE result;
  char *module_id_local;
  char *device_id_local;
  char *iothub_host_fqdn_local;
  AMQP_MESSENGER_LINK_CONFIG *link_config_local;
  SESSION_HANDLE session_handle_local;
  role link_role_local;
  
  link_address = (STRING_HANDLE)0x0;
  if (link_role) {
    local_a8 = link_config->source_suffix;
  }
  else {
    local_a8 = link_config->target_suffix;
  }
  result = (LINK_HANDLE)module_id;
  module_id_local = device_id;
  device_id_local = iothub_host_fqdn;
  iothub_host_fqdn_local = (char *)link_config;
  link_config_local = (AMQP_MESSENGER_LINK_CONFIG *)session_handle;
  session_handle_local._7_1_ = link_role;
  l = (LOGGER_LOG)create_link_address(iothub_host_fqdn,device_id,module_id,local_a8);
  if ((STRING_HANDLE)l == (STRING_HANDLE)0x0) {
    link_name = (STRING_HANDLE)xlogging_get_log_function();
    if (link_name != (STRING_HANDLE)0x0) {
      (*(code *)link_name)
                (0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                 ,"create_link",0x227,1,
                 "Failed creating the message sender (failed creating the \'link_address\')");
    }
    link_address = (STRING_HANDLE)0x0;
  }
  else {
    l_1 = (LOGGER_LOG)create_link_name((role)(session_handle_local._7_1_ & 1),module_id_local);
    if ((STRING_HANDLE)l_1 == (STRING_HANDLE)0x0) {
      source = (AMQP_VALUE)xlogging_get_log_function();
      if (source != (AMQP_VALUE)0x0) {
        (*(code *)source)(0,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                          ,"create_link",0x230,1,"Failed creating the link name");
      }
      link_address = (STRING_HANDLE)0x0;
    }
    else {
      target = (AMQP_VALUE)0x0;
      l_2 = (LOGGER_LOG)0x0;
      iVar1 = create_link_terminus
                        ((role)(session_handle_local._7_1_ & 1),(STRING_HANDLE)l_1,(STRING_HANDLE)l,
                         &target,(AMQP_VALUE *)&l_2);
      session = link_config_local;
      if (iVar1 == 0) {
        name = STRING_c_str((STRING_HANDLE)l_1);
        link_address = (STRING_HANDLE)
                       link_create((SESSION_HANDLE)session,name,
                                   (role)(session_handle_local._7_1_ & 1),target,(AMQP_VALUE)l_2);
        if ((LINK_HANDLE)link_address == (LINK_HANDLE)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                      ,"create_link",0x23c,1,"Failed creating the AMQP link");
          }
        }
        else {
          iVar1 = link_set_max_message_size((LINK_HANDLE)link_address,0xffffffffffffffff);
          if ((iVar1 != 0) && (p_Var2 = xlogging_get_log_function(), p_Var2 != (LOGGER_LOG)0x0)) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                      ,"create_link",0x242,1,"Failed setting link max message size.");
          }
          if ((*(long *)(iothub_host_fqdn_local + 0x18) != 0) &&
             (iVar1 = add_link_attach_properties
                                ((LINK_HANDLE)link_address,
                                 *(MAP_HANDLE *)(iothub_host_fqdn_local + 0x18)), iVar1 != 0)) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                        ,"create_link",0x248,1,"Failed setting link attach properties");
            }
            link_destroy((LINK_HANDLE)link_address);
            link_address = (STRING_HANDLE)0x0;
          }
        }
        amqpvalue_destroy(target);
        amqpvalue_destroy((AMQP_VALUE)l_2);
      }
      STRING_delete((STRING_HANDLE)l_1);
    }
    STRING_delete((STRING_HANDLE)l);
  }
  return (LINK_HANDLE)link_address;
}

Assistant:

static LINK_HANDLE create_link(role link_role, SESSION_HANDLE session_handle, AMQP_MESSENGER_LINK_CONFIG* link_config, const char* iothub_host_fqdn, const char* device_id, const char* module_id)
{
    LINK_HANDLE result = NULL;
    STRING_HANDLE link_address;

    if ((link_address = create_link_address(iothub_host_fqdn, device_id, module_id, (link_role == role_sender ? link_config->target_suffix : link_config->source_suffix))) == NULL)
    {
        LogError("Failed creating the message sender (failed creating the 'link_address')");
        result = NULL;
    }
    else
    {
        STRING_HANDLE link_name;

        if ((link_name = create_link_name(link_role, device_id)) == NULL)
        {
            LogError("Failed creating the link name");
            result = NULL;
        }
        else
        {
            AMQP_VALUE source = NULL;
            AMQP_VALUE target = NULL;

            if (create_link_terminus(link_role, link_name, link_address, &source, &target) == RESULT_OK)
            {
                if ((result = link_create(session_handle, STRING_c_str(link_name), link_role, source, target)) == NULL)
                {
                    LogError("Failed creating the AMQP link");
                }
                else
                {
                    if (link_set_max_message_size(result, MESSAGE_SENDER_MAX_LINK_SIZE) != RESULT_OK)
                    {
                        LogError("Failed setting link max message size.");
                    }

                    if (link_config->attach_properties != NULL &&
                        add_link_attach_properties(result, link_config->attach_properties) != RESULT_OK)
                    {
                        LogError("Failed setting link attach properties");
                        link_destroy(result);
                        result = NULL;
                    }
                }

                amqpvalue_destroy(source);
                amqpvalue_destroy(target);
            }

            STRING_delete(link_name);
        }

        STRING_delete(link_address);
    }

    return result;
}